

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

Promise<void> __thiscall
kj::Timer::timeoutAfter<void>(Timer *this,Duration delay,Promise<void> *promise)

{
  SourceLocation location;
  Promise<void> *in_RCX;
  SourceLocation local_70 [2];
  Promise<void> *local_40;
  Promise<void> local_38;
  Promise<void> local_30 [2];
  Promise<void> *promise_local;
  Timer *this_local;
  Duration delay_local;
  
  local_40 = promise;
  promise_local = (Promise<void> *)delay.value;
  this_local = (Timer *)promise;
  delay_local.value = (long)this;
  (**(code **)(*delay.value + 0x10))((Type *)&local_38,delay.value,promise);
  Promise<void>::
  then<kj::Timer::timeoutAfter<void>(kj::Quantity<long,kj::_::NanosecondLabel>,kj::Promise<void>&&)::_lambda()_1_>
            (local_30,(Type *)&local_38);
  SourceLocation::SourceLocation
            (local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/timer.h"
             ,"timeoutAfter",0x9b,10);
  location.function = local_70[0].function;
  location.fileName = local_70[0].fileName;
  location.lineNumber = local_70[0].lineNumber;
  location.columnNumber = local_70[0].columnNumber;
  Promise<void>::exclusiveJoin((Promise<void> *)this,in_RCX,location);
  Promise<void>::~Promise(local_30);
  Promise<void>::~Promise(&local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Timer::timeoutAfter(Duration delay, Promise<T>&& promise) {
  return promise.exclusiveJoin(afterDelay(delay).then([]() -> kj::Promise<T> {
    return makeTimeoutException();
  }));
}